

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::IfStatement(SQCompiler *this)

{
  SQUnsignedInteger SVar1;
  long lVar2;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQInteger arg0;
  SQFuncState *pSVar5;
  
  Lex(this);
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar5 = this->_fs;
  arg0 = SQFuncState::PopTarget(pSVar5);
  SQFuncState::AddInstruction(pSVar5,_OP_JZ,arg0,0,0,0);
  SVar1 = (this->_fs->_instructions)._size;
  IfBlock(this);
  lVar2 = this->_token;
  pSVar5 = this->_fs;
  SVar3 = (pSVar5->_instructions)._size;
  if (lVar2 == 0x111) {
    SQFuncState::AddInstruction(pSVar5,_OP_JMP,0,0,0,0);
    SVar4 = (this->_fs->_instructions)._size;
    Lex(this);
    IfBlock(this);
    SQFuncState::SetInstructionParam(this->_fs,SVar4 - 1,1,(this->_fs->_instructions)._size - SVar4)
    ;
    pSVar5 = this->_fs;
  }
  SQFuncState::SetInstructionParam(pSVar5,SVar1 - 1,1,(ulong)(lVar2 == 0x111) + (SVar3 - SVar1));
  return;
}

Assistant:

void IfStatement()
    {
        SQInteger jmppos;
        bool haselse = false;
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        SQInteger jnepos = _fs->GetCurrentPos();



        IfBlock();
        //
        /*static int n = 0;
        if (_token != _SC('}') && _token != TK_ELSE) {
            printf("IF %d-----------------------!!!!!!!!!\n", n);
            if (n == 5)
            {
                printf("asd");
            }
            n++;
            //OptionalSemicolon();
        }*/


        SQInteger endifblock = _fs->GetCurrentPos();
        if(_token == TK_ELSE){
            haselse = true;
            //BEGIN_SCOPE();
            _fs->AddInstruction(_OP_JMP);
            jmppos = _fs->GetCurrentPos();
            Lex();
            //Statement(); if(_lex._prevtoken != _SC('}')) OptionalSemicolon();
            IfBlock();
            //END_SCOPE();
            _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
        }
        _fs->SetInstructionParam(jnepos, 1, endifblock - jnepos + (haselse?1:0));
    }